

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O3

void __thiscall
RPCResult::RPCResult
          (RPCResult *this,string cond,Type type,string m_key_name,bool optional,string description,
          vector<RPCResult,_std::allocator<RPCResult>_> *inner)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer *ppRVar2;
  size_type *psVar3;
  pointer pRVar4;
  long lVar5;
  undefined7 in_register_00000011;
  undefined4 in_register_00000034;
  long *plVar6;
  bool in_R8B;
  long *in_R9;
  long in_FS_OFFSET;
  bool local_31;
  long local_30;
  
  plVar6 = (long *)CONCAT44(in_register_00000034,type);
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this->m_type = (Type)CONCAT71(in_register_00000011,optional);
  paVar1 = &(this->m_key_name).field_2;
  (this->m_key_name)._M_dataplus._M_p = (pointer)paVar1;
  pRVar4 = (inner->super__Vector_base<RPCResult,_std::allocator<RPCResult>_>)._M_impl.
           super__Vector_impl_data._M_start;
  ppRVar2 = &(inner->super__Vector_base<RPCResult,_std::allocator<RPCResult>_>)._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  if (pRVar4 == (pointer)ppRVar2) {
    pRVar4 = inner[1].super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
             super__Vector_impl_data._M_start;
    paVar1->_M_allocated_capacity = (size_type)*ppRVar2;
    *(pointer *)((long)&(this->m_key_name).field_2 + 8) = pRVar4;
  }
  else {
    (this->m_key_name)._M_dataplus._M_p = (pointer)pRVar4;
    (this->m_key_name).field_2._M_allocated_capacity = (size_type)*ppRVar2;
  }
  (this->m_key_name)._M_string_length =
       (size_type)
       (inner->super__Vector_base<RPCResult,_std::allocator<RPCResult>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  (inner->super__Vector_base<RPCResult,_std::allocator<RPCResult>_>)._M_impl.super__Vector_impl_data
  ._M_start = (pointer)ppRVar2;
  (inner->super__Vector_base<RPCResult,_std::allocator<RPCResult>_>)._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  *(undefined1 *)
   &(inner->super__Vector_base<RPCResult,_std::allocator<RPCResult>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = 0;
  pRVar4 = *(pointer *)(cond._M_dataplus._M_p + 8);
  (this->m_inner).super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = *(pointer *)cond._M_dataplus._M_p;
  (this->m_inner).super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar4;
  (this->m_inner).super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = *(pointer *)(cond._M_dataplus._M_p + 0x10);
  cond._M_dataplus._M_p[0x10] = '\0';
  cond._M_dataplus._M_p[0x11] = '\0';
  cond._M_dataplus._M_p[0x12] = '\0';
  cond._M_dataplus._M_p[0x13] = '\0';
  cond._M_dataplus._M_p[0x14] = '\0';
  cond._M_dataplus._M_p[0x15] = '\0';
  cond._M_dataplus._M_p[0x16] = '\0';
  cond._M_dataplus._M_p[0x17] = '\0';
  cond._M_dataplus._M_p[0] = '\0';
  cond._M_dataplus._M_p[1] = '\0';
  cond._M_dataplus._M_p[2] = '\0';
  cond._M_dataplus._M_p[3] = '\0';
  cond._M_dataplus._M_p[4] = '\0';
  cond._M_dataplus._M_p[5] = '\0';
  cond._M_dataplus._M_p[6] = '\0';
  cond._M_dataplus._M_p[7] = '\0';
  cond._M_dataplus._M_p[8] = '\0';
  cond._M_dataplus._M_p[9] = '\0';
  cond._M_dataplus._M_p[10] = '\0';
  cond._M_dataplus._M_p[0xb] = '\0';
  cond._M_dataplus._M_p[0xc] = '\0';
  cond._M_dataplus._M_p[0xd] = '\0';
  cond._M_dataplus._M_p[0xe] = '\0';
  cond._M_dataplus._M_p[0xf] = '\0';
  this->m_optional = in_R8B;
  this->m_skip_type_check = false;
  paVar1 = &(this->m_description).field_2;
  (this->m_description)._M_dataplus._M_p = (pointer)paVar1;
  psVar3 = (size_type *)(in_R9 + 2);
  if ((size_type *)*in_R9 == psVar3) {
    lVar5 = in_R9[3];
    paVar1->_M_allocated_capacity = *psVar3;
    *(long *)((long)&(this->m_description).field_2 + 8) = lVar5;
  }
  else {
    (this->m_description)._M_dataplus._M_p = (pointer)*in_R9;
    (this->m_description).field_2._M_allocated_capacity = *psVar3;
  }
  (this->m_description)._M_string_length = in_R9[1];
  *in_R9 = (long)psVar3;
  in_R9[1] = 0;
  *(undefined1 *)(in_R9 + 2) = 0;
  paVar1 = &(this->m_cond).field_2;
  (this->m_cond)._M_dataplus._M_p = (pointer)paVar1;
  psVar3 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar3) {
    lVar5 = plVar6[3];
    paVar1->_M_allocated_capacity = *psVar3;
    *(long *)((long)&(this->m_cond).field_2 + 8) = lVar5;
  }
  else {
    (this->m_cond)._M_dataplus._M_p = (pointer)*plVar6;
    (this->m_cond).field_2._M_allocated_capacity = *psVar3;
  }
  (this->m_cond)._M_string_length = plVar6[1];
  *plVar6 = (long)psVar3;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_31 = (this->m_cond)._M_string_length != 0;
  inline_check_non_fatal<bool>
            (&local_31,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/util.h",
             0x142,"RPCResult","!m_cond.empty()");
  CheckInnerDoc(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

RPCResult(
        std::string cond,
        Type type,
        std::string m_key_name,
        bool optional,
        std::string description,
        std::vector<RPCResult> inner = {})
        : m_type{std::move(type)},
          m_key_name{std::move(m_key_name)},
          m_inner{std::move(inner)},
          m_optional{optional},
          m_skip_type_check{false},
          m_description{std::move(description)},
          m_cond{std::move(cond)}
    {
        CHECK_NONFATAL(!m_cond.empty());
        CheckInnerDoc();
    }